

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

int nni_url_parse_inline(nng_url *url,char *raw)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  __int32_t **pp_Var6;
  long lVar7;
  char cVar8;
  size_t sVar9;
  char *pcVar10;
  byte *out;
  size_t sVar11;
  byte *__s;
  
  for (sVar9 = 0; (raw[sVar9] != '\0' && (raw[sVar9] != ':')); sVar9 = sVar9 + 1) {
  }
  pcVar5 = raw + sVar9;
  iVar3 = strncmp(pcVar5,"://",3);
  if (iVar3 != 0) {
LAB_00117527:
    iVar3 = 3;
    goto LAB_0011767e;
  }
  pcVar10 = "http";
  lVar7 = 0;
  do {
    iVar3 = strncmp(raw,pcVar10,sVar9);
    if (iVar3 == 0) {
      url->u_scheme = pcVar10;
      break;
    }
    pcVar10 = nni_schemes[lVar7 + 1];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x20);
  if (url->u_scheme == (char *)0x0) {
    iVar3 = 9;
    goto LAB_0011767e;
  }
  sVar9 = strlen(pcVar5);
  if (sVar9 < 0x80) {
    sVar11 = 0;
    snprintf(url->u_static,0x80,"%s",pcVar5);
    url->u_buffer = url->u_static;
  }
  else {
    pcVar10 = nni_strdup(pcVar5);
    url->u_buffer = pcVar10;
    sVar9 = strlen(pcVar5);
    sVar11 = sVar9 + 1;
  }
  url->u_bufsz = sVar11;
  pcVar5 = url->u_scheme;
  __s = (byte *)(url->u_buffer + 3);
  iVar3 = strcmp(pcVar5,"ipc");
  if ((((iVar3 != 0) && (iVar3 = strcmp(pcVar5,"unix"), iVar3 != 0)) &&
      (iVar3 = strcmp(pcVar5,"abstract"), iVar3 != 0)) &&
     ((iVar3 = strcmp(pcVar5,"inproc"), iVar3 != 0 &&
      (iVar3 = strcmp(pcVar5,"socket"), out = __s, iVar3 != 0)))) {
    while( true ) {
      bVar1 = *out;
      if (((ulong)bVar1 < 0x40) && ((0x8000800800000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
      out = out + 1;
    }
    *out = 0;
    pcVar5 = url->u_buffer;
    sVar9 = strlen((char *)__s);
    memmove(pcVar5,__s,sVar9 + 1);
    *out = bVar1;
    url->u_path = (char *)out;
    pcVar5 = url->u_buffer;
    url->u_hostname = pcVar5;
    pcVar10 = strchr(pcVar5,0x40);
    if (pcVar10 != (char *)0x0) {
      url->u_userinfo = pcVar5;
      *pcVar10 = '\0';
      url->u_hostname = pcVar10 + 1;
      pcVar5 = strchr(pcVar10 + 1,0x40);
      if (pcVar5 != (char *)0x0) goto LAB_00117527;
    }
    pcVar5 = url->u_hostname;
    cVar8 = *pcVar5;
    if (cVar8 != '\0') {
      lVar7 = 1;
      pp_Var6 = __ctype_tolower_loc();
      do {
        *pcVar5 = (char)(*pp_Var6)[cVar8];
        cVar8 = url->u_hostname[lVar7];
        pcVar5 = url->u_hostname + lVar7;
        lVar7 = lVar7 + 1;
      } while (cVar8 != '\0');
    }
    iVar3 = nni_url_canonify_uri((char *)out);
    if (iVar3 != 0) goto LAB_0011767e;
    for (; bVar1 = *out, bVar1 != 0; out = out + 1) {
      if (bVar1 == 0x23) goto LAB_00117799;
      if (bVar1 == 0x3f) {
        *out = 0;
        out = out + 1;
        url->u_query = (char *)out;
        goto LAB_00117787;
      }
    }
    goto LAB_001177a4;
  }
  url->u_path = (char *)__s;
  url->u_userinfo = (char *)0x0;
  url->u_hostname = (char *)0x0;
  url->u_query = (char *)0x0;
  url->u_fragment = (char *)0x0;
LAB_0011767b:
  iVar3 = 0;
LAB_0011767e:
  if ((iVar3 != 0) && (url->u_bufsz != 0)) {
    nni_free(url->u_buffer,url->u_bufsz);
    url->u_buffer = (char *)0x0;
    url->u_bufsz = 0;
  }
  return iVar3;
LAB_00117787:
  if (*out == 0) goto LAB_001177a4;
  if (*out == 0x23) goto LAB_00117799;
  out = out + 1;
  goto LAB_00117787;
LAB_00117799:
  *out = 0;
  url->u_fragment = (char *)(out + 1);
LAB_001177a4:
  pcVar5 = url->u_hostname;
  if (*pcVar5 == '[') {
    url->u_hostname = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
    do {
      pcVar10 = pcVar5;
      if (*pcVar10 == '\0') goto LAB_00117527;
      pcVar5 = pcVar10 + 1;
    } while (*pcVar10 != ']');
    *pcVar10 = '\0';
    if ((*pcVar5 != '\0') && (*pcVar5 != ':')) goto LAB_00117527;
  }
  else {
    for (; (*pcVar5 != '\0' && (*pcVar5 != ':')); pcVar5 = pcVar5 + 1) {
    }
  }
  cVar8 = *pcVar5;
  if (cVar8 == ':') {
    *pcVar5 = '\0';
    pcVar5 = pcVar5 + 1;
  }
  sVar9 = strlen(url->u_hostname);
  if (0xff < sVar9) {
    iVar3 = 3;
    goto LAB_0011767e;
  }
  if (cVar8 == ':') {
    if (*pcVar5 == '\0') goto LAB_00117527;
    iVar4 = nni_get_port_by_name(pcVar5,&url->u_port);
    iVar3 = 3;
    if (iVar4 != 0) goto LAB_0011767e;
  }
  else {
    uVar2 = nni_url_default_port(url->u_scheme);
    url->u_port = (uint)uVar2;
  }
  goto LAB_0011767b;
}

Assistant:

int
nni_url_parse_inline(nng_url *url, const char *raw)
{
	int rv = nni_url_parse_inline_inner(url, raw);
	if (rv != 0) {
		nni_url_fini(url);
	}
	return (rv);
}